

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_header(Curl_easy *data,char *hd,size_t hdlen)

{
  undefined1 *puVar1;
  char cVar2;
  connectdata *conn;
  altsvcinfo *asi;
  curl_trc_feat *pcVar3;
  uchar uVar4;
  _Bool _Var5;
  unsigned_short srcport;
  int iVar6;
  CURLcode CVar7;
  CURLofft CVar8;
  uint uVar9;
  curl_off_t in_RAX;
  time_t tVar10;
  time_t tVar11;
  alpnid srcalpnid;
  char *pcVar12;
  curl_off_t contentlength;
  
  conn = data->conn;
  cVar2 = *hd;
  switch(cVar2) {
  case 'L':
switchD_00132dbf_caseD_6c:
    if (((data->req).field_0xda & 8) == 0) {
      if ((data->set).timecondition == '\0') {
        if ((0xd < hdlen) && ((*(ulong *)&(data->set).field_0x8ca & 0x80) != 0)) goto LAB_001333d1;
      }
      else if (0xd < hdlen) {
LAB_001333d1:
        iVar6 = curl_strnequal("Last-Modified:",hd,0xe);
        if (iVar6 != 0) {
          tVar10 = Curl_getdate_capped(hd + 0xe);
          (data->req).timeofdoc = tVar10;
          if (((data->set).field_0x8ca & 0x80) != 0) {
            (data->info).filetime = tVar10;
            return CURLE_OK;
          }
          return CURLE_OK;
        }
      }
    }
    uVar9 = (data->req).httpcode;
    if (((299 < (int)uVar9) && (8 < hdlen && uVar9 < 400)) &&
       ((iVar6 = curl_strnequal("Location:",hd,9), iVar6 != 0 &&
        ((data->req).location == (char *)0x0)))) {
      pcVar12 = Curl_copy_header_value(hd);
      if (pcVar12 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      if (*pcVar12 == '\0') {
        (*Curl_cfree)(pcVar12);
      }
      else {
        (data->req).location = pcVar12;
        if (((data->set).field_0x8cc & 0x20) != 0) {
          pcVar12 = (*Curl_cstrdup)(pcVar12);
          (data->req).newurl = pcVar12;
          if (pcVar12 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          http_perhapsrewind(data,conn);
          puVar1 = &(data->state).field_0x774;
          *puVar1 = *puVar1 | 2;
        }
      }
    }
    break;
  case 'M':
  case 'N':
  case 'O':
  case 'Q':
  case 'U':
  case 'V':
    break;
  case 'P':
switchD_00132dbf_caseD_70:
    if ((0x10 < hdlen) && (iVar6 = curl_strnequal("Proxy-Connection:",hd,0x11), iVar6 != 0)) {
      uVar4 = conn->httpversion;
      if (uVar4 == '\n') {
        if ((((((ulong)conn->bits & 1) != 0) &&
             (iVar6 = curl_strnequal("Proxy-Connection:",hd,0x11), 0x1b < hdlen)) && (iVar6 != 0))
           && (_Var5 = Curl_compareheader(hd,"Proxy-Connection:",0x11,"keep-alive",10), _Var5)) {
          Curl_conncontrol(conn,0);
          if (((data->set).field_0x8cd & 0x10) == 0) {
            return CURLE_OK;
          }
          pcVar3 = (data->state).feat;
          if ((pcVar3 != (curl_trc_feat *)0x0) && (pcVar3->log_level < 1)) {
            return CURLE_OK;
          }
          pcVar12 = "HTTP/1.0 proxy connection set to keep alive";
          goto LAB_00133803;
        }
        uVar4 = conn->httpversion;
      }
      if (uVar4 != '\v') {
        return CURLE_OK;
      }
      if (((ulong)conn->bits & 1) == 0) {
        return CURLE_OK;
      }
      iVar6 = curl_strnequal("Proxy-Connection:",hd,0x11);
      if (hdlen < 0x17) {
        return CURLE_OK;
      }
      if (iVar6 == 0) {
        return CURLE_OK;
      }
      _Var5 = Curl_compareheader(hd,"Proxy-Connection:",0x11,"close",5);
      if (!_Var5) {
        return CURLE_OK;
      }
      Curl_conncontrol(conn,1);
      if (((data->set).field_0x8cd & 0x10) == 0) {
        return CURLE_OK;
      }
      pcVar3 = (data->state).feat;
      if ((pcVar3 != (curl_trc_feat *)0x0) && (pcVar3->log_level < 1)) {
        return CURLE_OK;
      }
      pcVar12 = "HTTP/1.1 proxy connection set close";
LAB_00133803:
      Curl_infof(data,pcVar12);
      return CURLE_OK;
    }
    if (((0x12 < hdlen) && ((data->req).httpcode == 0x197)) &&
       (iVar6 = curl_strnequal("Proxy-authenticate:",hd,0x13), iVar6 != 0)) {
      pcVar12 = Curl_copy_header_value(hd);
      if (pcVar12 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      Curl_http_input_auth(data,true,pcVar12);
      (*Curl_cfree)(pcVar12);
      goto LAB_00133842;
    }
    break;
  case 'R':
switchD_00132dbf_caseD_72:
    if ((0xb < hdlen) && (iVar6 = curl_strnequal("Retry-After:",hd,0xc), iVar6 != 0)) {
      contentlength = 0;
      curlx_strtoofft(hd + 0xc,(char **)0x0,10,&contentlength);
      if ((contentlength == 0) && (tVar10 = Curl_getdate_capped(hd + 0xc), tVar10 != -1)) {
        tVar11 = time((time_t *)0x0);
        contentlength = tVar10 - tVar11;
      }
      (data->info).retry_after = contentlength;
      return CURLE_OK;
    }
    break;
  case 'S':
switchD_00132dbf_caseD_73:
    if (((data->cookies != (CookieInfo *)0x0) && (10 < hdlen)) &&
       (((*(uint *)&(data->state).field_0x774 & 0x800) != 0 &&
        (iVar6 = curl_strnequal("Set-Cookie:",hd,0xb), iVar6 != 0)))) {
      pcVar12 = (data->state).aptr.cookiehost;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = (conn->host).name;
      }
      _Var5 = true;
      if ((((conn->handler->protocol & 0x80000002) == 0) &&
          (iVar6 = curl_strequal("localhost",pcVar12), iVar6 == 0)) &&
         (iVar6 = strcmp(pcVar12,"127.0.0.1"), iVar6 != 0)) {
        iVar6 = strcmp(pcVar12,"::1");
        _Var5 = iVar6 == 0;
      }
      Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
      Curl_cookie_add(data,data->cookies,true,false,hd + 0xb,pcVar12,(data->state).up.path,_Var5);
      Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
      return CURLE_OK;
    }
    if (((((data->hsts != (hsts *)0x0) && (0x19 < hdlen)) &&
         (((conn->handler->flags & 1) != 0 &&
          ((iVar6 = curl_strnequal("Strict-Transport-Security:",hd,0x1a), iVar6 != 0 &&
           (CVar7 = Curl_hsts_parse(data->hsts,(conn->host).name,hd + 0x1a), CVar7 != CURLE_OK))))))
        && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) {
      Curl_infof(data,"Illegal STS header skipped");
    }
    break;
  case 'T':
switchD_00132dbf_caseD_74:
    if (((((data->req).field_0xda & 8) == 0) && ((data->state).httpreq != '\x05')) &&
       ((0x11 < hdlen && ((data->req).httpcode != 0x130)))) {
      iVar6 = curl_strnequal("Transfer-Encoding:",hd,0x12);
      if (iVar6 != 0) {
        CVar7 = Curl_build_unencoding_stack(data,hd + 0x12,1);
        if (CVar7 != CURLE_OK) {
          return CVar7;
        }
        if (((data->req).field_0xda & 0x10) == 0) {
          if (((data->set).field_0x8cc & 0x40) != 0) {
            Curl_conncontrol(conn,1);
            puVar1 = &(data->req).field_0xda;
            *puVar1 = *puVar1 | 0x40;
            return CURLE_OK;
          }
          return CURLE_OK;
        }
        return CURLE_OK;
      }
    }
    else if (hdlen < 8) break;
    iVar6 = curl_strnequal("Trailer:",hd,8);
    if (iVar6 == 0) break;
    puVar1 = &(data->req).field_0xda;
    *puVar1 = *puVar1 | 0x20;
    goto LAB_00133842;
  case 'W':
switchD_00132dbf_caseD_77:
    if (((0x10 < hdlen) && ((data->req).httpcode == 0x191)) &&
       (iVar6 = curl_strnequal("WWW-Authenticate:",hd,0x11), iVar6 != 0)) {
      pcVar12 = Curl_copy_header_value(hd);
      if (pcVar12 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      Curl_http_input_auth(data,false,pcVar12);
      (*Curl_cfree)(pcVar12);
      return CURLE_OK;
    }
    break;
  default:
    switch(cVar2) {
    case 'l':
      goto switchD_00132dbf_caseD_6c;
    case 'm':
    case 'n':
    case 'o':
    case 'q':
    case 'u':
    case 'v':
      break;
    case 'p':
      goto switchD_00132dbf_caseD_70;
    case 'r':
      goto switchD_00132dbf_caseD_72;
    case 's':
      goto switchD_00132dbf_caseD_73;
    case 't':
      goto switchD_00132dbf_caseD_74;
    case 'w':
      goto switchD_00132dbf_caseD_77;
    default:
      if (cVar2 == 'A') {
LAB_00132e1a:
        if ((((data->asi != (altsvcinfo *)0x0) && (7 < hdlen)) && ((conn->handler->flags & 1) != 0))
           && (iVar6 = curl_strnequal("Alt-Svc:",hd,8), iVar6 != 0)) {
          srcalpnid = ALPN_h3;
          if (conn->httpversion != '\x1e') {
            srcalpnid = (uint)(conn->httpversion == '\x14') * 8 + ALPN_h1;
          }
          asi = data->asi;
          pcVar12 = (conn->host).name;
          srcport = curlx_uitous(conn->remote_port);
          CVar7 = Curl_altsvc_parse(data,asi,hd + 8,srcalpnid,pcVar12,srcport);
          return CVar7;
        }
        break;
      }
      if ((cVar2 != 'C') && (cVar2 != 'c')) {
        if (cVar2 != 'a') break;
        goto LAB_00132e1a;
      }
      uVar9 = *(uint *)&(data->req).field_0xd9;
      if ((((uVar9 >> 0xb & 1) == 0) && (0xe < hdlen)) &&
         ((*(ulong *)&(data->set).field_0x8ca & 0x200000000) == 0)) {
        contentlength = in_RAX;
        iVar6 = curl_strnequal("Content-Length:",hd,0xf);
        if (iVar6 == 0) {
          uVar9 = *(uint *)&(data->req).field_0xd9;
          goto LAB_001334d1;
        }
        CVar8 = curlx_strtoofft(hd + 0xf,(char **)0x0,10,&contentlength);
        if (CVar8 == CURL_OFFT_FLOW) {
          if ((data->set).max_filesize != 0) {
            Curl_failf(data,"Maximum file size exceeded");
            return CURLE_FILESIZE_EXCEEDED;
          }
          Curl_conncontrol(conn,2);
          if (((data->set).field_0x8cd & 0x10) == 0) {
            return CURLE_OK;
          }
          pcVar3 = (data->state).feat;
          if ((pcVar3 != (curl_trc_feat *)0x0) && (pcVar3->log_level < 1)) {
            return CURLE_OK;
          }
          pcVar12 = "Overflow Content-Length: value";
          goto LAB_00133803;
        }
        if (CVar8 != CURL_OFFT_OK) {
          Curl_failf(data,"Invalid Content-Length: value");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        (data->req).size = contentlength;
        (data->req).maxdownload = contentlength;
      }
      else {
LAB_001334d1:
        if ((((uVar9 >> 0xb & 1) != 0) || (hdlen < 0x11)) || ((data->set).str[0x21] == (char *)0x0))
        {
          if (0xc < hdlen) goto LAB_00133522;
          if (10 < hdlen) goto LAB_00133583;
LAB_00133653:
          if (((0xd < hdlen) && ((*(uint *)&(data->req).field_0xd9 & 0x800) == 0)) &&
             (iVar6 = curl_strnequal("Content-Range:",hd,0xe), iVar6 != 0)) {
            for (pcVar12 = hd + 0xe; cVar2 = *pcVar12, cVar2 != '\0'; pcVar12 = pcVar12 + 1) {
              if ((byte)(cVar2 - 0x30U) < 10) {
                CVar8 = curlx_strtoofft(pcVar12,(char **)0x0,10,&(data->req).offset);
                if ((CVar8 == CURL_OFFT_OK) && ((data->state).resume_from == (data->req).offset)) {
                  puVar1 = &(data->req).field_0xd9;
                  *puVar1 = *puVar1 | 4;
                }
                goto switchD_00132dbf_caseD_6d;
              }
              if (cVar2 == '*') break;
            }
            if ((data->req).httpcode < 300) {
              (data->state).resume_from = 0;
            }
          }
          break;
        }
        iVar6 = curl_strnequal("Content-Encoding:",hd,0x11);
        if (iVar6 != 0) {
          CVar7 = Curl_build_unencoding_stack(data,hd + 0x11,0);
          return CVar7;
        }
LAB_00133522:
        iVar6 = curl_strnequal("Content-Type:",hd,0xd);
        if (iVar6 == 0) {
LAB_00133583:
          iVar6 = curl_strnequal("Connection:",hd,0xb);
          if (((hdlen < 0x11) || (iVar6 == 0)) ||
             (_Var5 = Curl_compareheader(hd,"Connection:",0xb,"close",5), !_Var5)) {
            if (((conn->httpversion == '\n') &&
                (iVar6 = curl_strnequal("Connection:",hd,0xb), 0x15 < hdlen)) &&
               ((iVar6 != 0 &&
                (_Var5 = Curl_compareheader(hd,"Connection:",0xb,"keep-alive",10), _Var5)))) {
              Curl_conncontrol(conn,0);
              if (((data->set).field_0x8cd & 0x10) == 0) {
                return CURLE_OK;
              }
              pcVar3 = (data->state).feat;
              if ((pcVar3 != (curl_trc_feat *)0x0) && (pcVar3->log_level < 1)) {
                return CURLE_OK;
              }
              pcVar12 = "HTTP/1.0 connection set to keep alive";
              goto LAB_00133803;
            }
            goto LAB_00133653;
          }
          Curl_conncontrol(conn,2);
        }
        else {
          pcVar12 = Curl_copy_header_value(hd);
          if (pcVar12 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          if (*pcVar12 == '\0') {
            (*Curl_cfree)(pcVar12);
          }
          else {
            (*Curl_cfree)((data->info).contenttype);
            (data->info).contenttype = pcVar12;
          }
        }
      }
      goto LAB_00133842;
    }
  }
switchD_00132dbf_caseD_6d:
  if (((conn->handler->protocol & 0x40000) == 0) ||
     (CVar7 = Curl_rtsp_parseheader(data,hd), CVar7 == CURLE_OK)) {
LAB_00133842:
    CVar7 = CURLE_OK;
  }
  return CVar7;
}

Assistant:

CURLcode Curl_http_header(struct Curl_easy *data,
                          const char *hd, size_t hdlen)
{
  struct connectdata *conn = data->conn;
  CURLcode result;
  struct SingleRequest *k = &data->req;
  const char *v;

  switch(hd[0]) {
  case 'a':
  case 'A':
#ifndef CURL_DISABLE_ALTSVC
    v = (data->asi &&
         ((data->conn->handler->flags & PROTOPT_SSL) ||
#ifdef DEBUGBUILD
          /* allow debug builds to circumvent the HTTPS restriction */
          getenv("CURL_ALTSVC_HTTP")
#else
          0
#endif
        )) ? HD_VAL(hd, hdlen, "Alt-Svc:") : NULL;
    if(v) {
      /* the ALPN of the current request */
      enum alpnid id = (conn->httpversion == 30) ? ALPN_h3 :
                         (conn->httpversion == 20) ? ALPN_h2 : ALPN_h1;
      return Curl_altsvc_parse(data, data->asi, v, id, conn->host.name,
                               curlx_uitous((unsigned int)conn->remote_port));
    }
#endif
    break;
  case 'c':
  case 'C':
    /* Check for Content-Length: header lines to get size */
    v = (!k->http_bodyless && !data->set.ignorecl) ?
      HD_VAL(hd, hdlen, "Content-Length:") : NULL;
    if(v) {
      curl_off_t contentlength;
      CURLofft offt = curlx_strtoofft(v, NULL, 10, &contentlength);

      if(offt == CURL_OFFT_OK) {
        k->size = contentlength;
        k->maxdownload = k->size;
      }
      else if(offt == CURL_OFFT_FLOW) {
        /* out of range */
        if(data->set.max_filesize) {
          failf(data, "Maximum file size exceeded");
          return CURLE_FILESIZE_EXCEEDED;
        }
        streamclose(conn, "overflow content-length");
        infof(data, "Overflow Content-Length: value");
      }
      else {
        /* negative or just rubbish - bad HTTP */
        failf(data, "Invalid Content-Length: value");
        return CURLE_WEIRD_SERVER_REPLY;
      }
      return CURLE_OK;
    }
    v = (!k->http_bodyless && data->set.str[STRING_ENCODING]) ?
      HD_VAL(hd, hdlen, "Content-Encoding:") : NULL;
    if(v) {
      /*
       * Process Content-Encoding. Look for the values: identity,
       * gzip, deflate, compress, x-gzip and x-compress. x-gzip and
       * x-compress are the same as gzip and compress. (Sec 3.5 RFC
       * 2616). zlib cannot handle compress. However, errors are
       * handled further down when the response body is processed
       */
      return Curl_build_unencoding_stack(data, v, FALSE);
    }
    /* check for Content-Type: header lines to get the MIME-type */
    v = HD_VAL(hd, hdlen, "Content-Type:");
    if(v) {
      char *contenttype = Curl_copy_header_value(hd);
      if(!contenttype)
        return CURLE_OUT_OF_MEMORY;
      if(!*contenttype)
        /* ignore empty data */
        free(contenttype);
      else {
        Curl_safefree(data->info.contenttype);
        data->info.contenttype = contenttype;
      }
      return CURLE_OK;
    }
    if(HD_IS_AND_SAYS(hd, hdlen, "Connection:", "close")) {
      /*
       * [RFC 2616, section 8.1.2.1]
       * "Connection: close" is HTTP/1.1 language and means that
       * the connection will close when this request has been
       * served.
       */
      streamclose(conn, "Connection: close used");
      return CURLE_OK;
    }
    if((conn->httpversion == 10) &&
       HD_IS_AND_SAYS(hd, hdlen, "Connection:", "keep-alive")) {
      /*
       * An HTTP/1.0 reply with the 'Connection: keep-alive' line
       * tells us the connection will be kept alive for our
       * pleasure. Default action for 1.0 is to close.
       *
       * [RFC2068, section 19.7.1] */
      connkeep(conn, "Connection keep-alive");
      infof(data, "HTTP/1.0 connection set to keep alive");
      return CURLE_OK;
    }
    v = !k->http_bodyless ? HD_VAL(hd, hdlen, "Content-Range:") : NULL;
    if(v) {
      /* Content-Range: bytes [num]-
         Content-Range: bytes: [num]-
         Content-Range: [num]-
         Content-Range: [asterisk]/[total]

         The second format was added since Sun's webserver
         JavaWebServer/1.1.1 obviously sends the header this way!
         The third added since some servers use that!
         The fourth means the requested range was unsatisfied.
      */

      const char *ptr = v;

      /* Move forward until first digit or asterisk */
      while(*ptr && !ISDIGIT(*ptr) && *ptr != '*')
        ptr++;

      /* if it truly stopped on a digit */
      if(ISDIGIT(*ptr)) {
        if(!curlx_strtoofft(ptr, NULL, 10, &k->offset)) {
          if(data->state.resume_from == k->offset)
            /* we asked for a resume and we got it */
            k->content_range = TRUE;
        }
      }
      else if(k->httpcode < 300)
        data->state.resume_from = 0; /* get everything */
    }
    break;
  case 'l':
  case 'L':
    v = (!k->http_bodyless &&
         (data->set.timecondition || data->set.get_filetime)) ?
        HD_VAL(hd, hdlen, "Last-Modified:") : NULL;
    if(v) {
      k->timeofdoc = Curl_getdate_capped(v);
      if(data->set.get_filetime)
        data->info.filetime = k->timeofdoc;
      return CURLE_OK;
    }
    if((k->httpcode >= 300 && k->httpcode < 400) &&
            HD_IS(hd, hdlen, "Location:") &&
            !data->req.location) {
      /* this is the URL that the server advises us to use instead */
      char *location = Curl_copy_header_value(hd);
      if(!location)
        return CURLE_OUT_OF_MEMORY;
      if(!*location)
        /* ignore empty data */
        free(location);
      else {
        data->req.location = location;

        if(data->set.http_follow_location) {
          DEBUGASSERT(!data->req.newurl);
          data->req.newurl = strdup(data->req.location); /* clone */
          if(!data->req.newurl)
            return CURLE_OUT_OF_MEMORY;

          /* some cases of POST and PUT etc needs to rewind the data
             stream at this point */
          result = http_perhapsrewind(data, conn);
          if(result)
            return result;

          /* mark the next request as a followed location: */
          data->state.this_is_a_follow = TRUE;
        }
      }
    }
    break;
  case 'p':
  case 'P':
#ifndef CURL_DISABLE_PROXY
    v = HD_VAL(hd, hdlen, "Proxy-Connection:");
    if(v) {
      if((conn->httpversion == 10) && conn->bits.httpproxy &&
         HD_IS_AND_SAYS(hd, hdlen, "Proxy-Connection:", "keep-alive")) {
        /*
         * When an HTTP/1.0 reply comes when using a proxy, the
         * 'Proxy-Connection: keep-alive' line tells us the
         * connection will be kept alive for our pleasure.
         * Default action for 1.0 is to close.
         */
        connkeep(conn, "Proxy-Connection keep-alive"); /* do not close */
        infof(data, "HTTP/1.0 proxy connection set to keep alive");
      }
      else if((conn->httpversion == 11) && conn->bits.httpproxy &&
              HD_IS_AND_SAYS(hd, hdlen, "Proxy-Connection:", "close")) {
        /*
         * We get an HTTP/1.1 response from a proxy and it says it will
         * close down after this transfer.
         */
        connclose(conn, "Proxy-Connection: asked to close after done");
        infof(data, "HTTP/1.1 proxy connection set close");
      }
      return CURLE_OK;
    }
#endif
    if((407 == k->httpcode) && HD_IS(hd, hdlen, "Proxy-authenticate:")) {
      char *auth = Curl_copy_header_value(hd);
      if(!auth)
        return CURLE_OUT_OF_MEMORY;
      result = Curl_http_input_auth(data, TRUE, auth);
      free(auth);
      return result;
    }
#ifdef USE_SPNEGO
    if(HD_IS(hd, hdlen, "Persistent-Auth:")) {
      struct negotiatedata *negdata = &conn->negotiate;
      struct auth *authp = &data->state.authhost;
      if(authp->picked == CURLAUTH_NEGOTIATE) {
        char *persistentauth = Curl_copy_header_value(hd);
        if(!persistentauth)
          return CURLE_OUT_OF_MEMORY;
        negdata->noauthpersist = checkprefix("false", persistentauth) ?
          TRUE : FALSE;
        negdata->havenoauthpersist = TRUE;
        infof(data, "Negotiate: noauthpersist -> %d, header part: %s",
              negdata->noauthpersist, persistentauth);
        free(persistentauth);
      }
    }
#endif
    break;
  case 'r':
  case 'R':
    v = HD_VAL(hd, hdlen, "Retry-After:");
    if(v) {
      /* Retry-After = HTTP-date / delay-seconds */
      curl_off_t retry_after = 0; /* zero for unknown or "now" */
      /* Try it as a decimal number, if it works it is not a date */
      (void)curlx_strtoofft(v, NULL, 10, &retry_after);
      if(!retry_after) {
        time_t date = Curl_getdate_capped(v);
        if(-1 != date)
          /* convert date to number of seconds into the future */
          retry_after = date - time(NULL);
      }
      data->info.retry_after = retry_after; /* store it */
      return CURLE_OK;
    }
    break;
  case 's':
  case 'S':
#if !defined(CURL_DISABLE_COOKIES)
    v = (data->cookies && data->state.cookie_engine) ?
        HD_VAL(hd, hdlen, "Set-Cookie:") : NULL;
    if(v) {
      /* If there is a custom-set Host: name, use it here, or else use
       * real peer hostname. */
      const char *host = data->state.aptr.cookiehost ?
        data->state.aptr.cookiehost : conn->host.name;
      const bool secure_context =
        conn->handler->protocol&(CURLPROTO_HTTPS|CURLPROTO_WSS) ||
        strcasecompare("localhost", host) ||
        !strcmp(host, "127.0.0.1") ||
        !strcmp(host, "::1") ? TRUE : FALSE;

      Curl_share_lock(data, CURL_LOCK_DATA_COOKIE,
                      CURL_LOCK_ACCESS_SINGLE);
      Curl_cookie_add(data, data->cookies, TRUE, FALSE, v, host,
                      data->state.up.path, secure_context);
      Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
      return CURLE_OK;
    }
#endif
#ifndef CURL_DISABLE_HSTS
    /* If enabled, the header is incoming and this is over HTTPS */
    v = (data->hsts &&
         ((conn->handler->flags & PROTOPT_SSL) ||
#ifdef DEBUGBUILD
           /* allow debug builds to circumvent the HTTPS restriction */
           getenv("CURL_HSTS_HTTP")
#else
           0
#endif
            )
        ) ? HD_VAL(hd, hdlen, "Strict-Transport-Security:") : NULL;
    if(v) {
      CURLcode check =
        Curl_hsts_parse(data->hsts, conn->host.name, v);
      if(check)
        infof(data, "Illegal STS header skipped");
#ifdef DEBUGBUILD
      else
        infof(data, "Parsed STS header fine (%zu entries)",
              Curl_llist_count(&data->hsts->list));
#endif
    }
#endif
    break;
  case 't':
  case 'T':
    /* RFC 9112, ch. 6.1
     * "Transfer-Encoding MAY be sent in a response to a HEAD request or
     *  in a 304 (Not Modified) response (Section 15.4.5 of [HTTP]) to a
     *  GET request, neither of which includes a message body, to indicate
     *  that the origin server would have applied a transfer coding to the
     *  message body if the request had been an unconditional GET."
     *
     * Read: in these cases the 'Transfer-Encoding' does not apply
     * to any data following the response headers. Do not add any decoders.
     */
    v = (!k->http_bodyless &&
         (data->state.httpreq != HTTPREQ_HEAD) &&
         (k->httpcode != 304)) ?
      HD_VAL(hd, hdlen, "Transfer-Encoding:") : NULL;
    if(v) {
      /* One or more encodings. We check for chunked and/or a compression
         algorithm. */
      result = Curl_build_unencoding_stack(data, v, TRUE);
      if(result)
        return result;
      if(!k->chunk && data->set.http_transfer_encoding) {
        /* if this is not chunked, only close can signal the end of this
         * transfer as Content-Length is said not to be trusted for
         * transfer-encoding! */
        connclose(conn, "HTTP/1.1 transfer-encoding without chunks");
        k->ignore_cl = TRUE;
      }
      return CURLE_OK;
    }
    v = HD_VAL(hd, hdlen, "Trailer:");
    if(v) {
      data->req.resp_trailer = TRUE;
      return CURLE_OK;
    }
    break;
  case 'w':
  case 'W':
    if((401 == k->httpcode) && HD_IS(hd, hdlen, "WWW-Authenticate:")) {
      char *auth = Curl_copy_header_value(hd);
      if(!auth)
        return CURLE_OUT_OF_MEMORY;
      result = Curl_http_input_auth(data, FALSE, auth);
      free(auth);
      return result;
    }
    break;
  }

  if(conn->handler->protocol & CURLPROTO_RTSP) {
    result = Curl_rtsp_parseheader(data, hd);
    if(result)
      return result;
  }
  return CURLE_OK;
}